

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.c
# Opt level: O0

int Mio_CommandReadGenlib(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  FILE *__stream_00;
  Mio_Library_t *pLib_00;
  Amap_Lib_t *pLib_01;
  char *pcVar4;
  double dVar5;
  uint local_74;
  int fVerbose;
  int c;
  int fShortNames;
  double WireDelay;
  char *pExcludeFile;
  char *pFileName;
  Amap_Lib_t *pLib2;
  Mio_Library_t *pLib;
  FILE *pErr;
  FILE *pOut;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  WireDelay = 0.0;
  _c = 0.0;
  bVar1 = false;
  local_74 = 1;
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  Extra_UtilGetoptReset();
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"WEnvh");
    if (iVar2 == -1) {
      if (argc == globalUtilOptind + 1) {
        pcVar4 = argv[globalUtilOptind];
        __stream_00 = (FILE *)Io_FileOpen(pcVar4,"open_path","r",0);
        if (__stream_00 == (FILE *)0x0) {
          fprintf(__stream,"Cannot open input file \"%s\". ",pcVar4);
          pcVar4 = Extra_FileGetSimilarName(pcVar4,".genlib",".lib",".scl",".g",(char *)0x0);
          if (pcVar4 != (char *)0x0) {
            fprintf(__stream,"Did you mean \"%s\"?",pcVar4);
          }
          fprintf(__stream,"\n");
          return 1;
        }
        fclose(__stream_00);
        pLib_00 = Mio_LibraryRead(pcVar4,(char *)0x0,(char *)WireDelay,local_74);
        if (pLib_00 == (Mio_Library_t *)0x0) {
          fprintf(__stream,"Reading genlib library has failed.\n");
          return 1;
        }
        if (local_74 != 0) {
          uVar3 = Mio_LibraryReadGateNum(pLib_00);
          printf("Entered genlib library with %d gates from file \"%s\".\n",(ulong)uVar3,pcVar4);
        }
        if (bVar1) {
          Mio_LibraryShortNames(pLib_00);
        }
        if ((_c != 0.0) || (NAN(_c))) {
          Mio_LibraryShiftDelay(pLib_00,_c);
        }
        Mio_UpdateGenlib(pLib_00);
        pLib_01 = Amap_LibReadAndPrepare(pcVar4,(char *)0x0,0,0);
        if (pLib_01 == (Amap_Lib_t *)0x0) {
          fprintf(__stream,"Reading second genlib library has failed.\n");
          return 1;
        }
        Abc_FrameSetLibGen2(pLib_01);
        return 0;
      }
      goto LAB_00483054;
    }
    switch(iVar2) {
    case 0x45:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-E\" should be followed by a file name.\n");
        goto LAB_00483054;
      }
      WireDelay = (double)argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      break;
    default:
      goto LAB_00483054;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by a floating point number.\n");
        goto LAB_00483054;
      }
      dVar5 = atof(argv[globalUtilOptind]);
      _c = (double)(float)dVar5;
      globalUtilOptind = globalUtilOptind + 1;
      if (_c <= 0.0) {
LAB_00483054:
        fprintf(__stream,"usage: read_genlib [-W float] [-E filename] [-nvh]\n");
        fprintf(__stream,"\t           read the library from a genlib file\n");
        fprintf(__stream,"\t           (if the library contains more than one gate\n");
        fprintf(__stream,"\t           with the same Boolean function, only the gate\n");
        fprintf(__stream,"\t           with the smallest area will be used)\n");
        fprintf(__stream,
                "\t-W float : wire delay (added to pin-to-pin gate delays) [default = %g]\n",_c);
        fprintf(__stream,"\t-E file :  the file name with gates to be excluded [default = none]\n");
        pcVar4 = "no";
        if (bVar1) {
          pcVar4 = "yes";
        }
        fprintf(__stream,
                "\t-n       : toggle replacing gate/pin names by short strings [default = %s]\n",
                pcVar4);
        pcVar4 = "no";
        if (local_74 != 0) {
          pcVar4 = "yes";
        }
        fprintf(__stream,"\t-v       : toggle verbose printout [default = %s]\n",pcVar4);
        fprintf(__stream,"\t-h       : enable verbose output\n");
        return 1;
      }
      break;
    case 0x68:
      goto LAB_00483054;
    case 0x6e:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x76:
      local_74 = local_74 ^ 1;
    }
  } while( true );
}

Assistant:

int Mio_CommandReadGenlib( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pFile;
    FILE * pOut, * pErr;
    Mio_Library_t * pLib;
    Amap_Lib_t * pLib2;
    char * pFileName;
    char * pExcludeFile = NULL;
    double WireDelay = 0.0;
    int fShortNames = 0;
    int c, fVerbose = 1;

    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "WEnvh")) != EOF ) 
    {
        switch (c) 
        {
            case 'W':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-W\" should be followed by a floating point number.\n" );
                    goto usage;
                }
                WireDelay = (float)atof(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( WireDelay <= 0.0 ) 
                    goto usage;
                break;
            case 'E':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-E\" should be followed by a file name.\n" );
                    goto usage;
                }
                pExcludeFile = argv[globalUtilOptind];
                globalUtilOptind++;
                break;
            case 'n':
                fShortNames ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }

    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = Io_FileOpen( pFileName, "open_path", "r", 0 )) == NULL )
    {
        fprintf( pErr, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".genlib", ".lib", ".scl", ".g", NULL )) )
            fprintf( pErr, "Did you mean \"%s\"?", pFileName );
        fprintf( pErr, "\n" );
        return 1;
    }
    fclose( pFile );

    // set the new network
    pLib = Mio_LibraryRead( pFileName, NULL, pExcludeFile, fVerbose );  
    if ( pLib == NULL )
    {
        fprintf( pErr, "Reading genlib library has failed.\n" );
        return 1;
    }
    if ( fVerbose )
        printf( "Entered genlib library with %d gates from file \"%s\".\n", Mio_LibraryReadGateNum(pLib), pFileName );

    // convert the library if needed
    if ( fShortNames )
        Mio_LibraryShortNames( pLib );

    // add the fixed number (wire delay) to all delays in the library
    if ( WireDelay != 0.0 )
        Mio_LibraryShiftDelay( pLib, WireDelay );

    // prepare libraries
    Mio_UpdateGenlib( pLib );

    // replace the current library
    pLib2 = Amap_LibReadAndPrepare( pFileName, NULL, 0, 0 );  
    if ( pLib2 == NULL )
    {
        fprintf( pErr, "Reading second genlib library has failed.\n" );
        return 1;
    }
    Abc_FrameSetLibGen2( pLib2 );
    return 0;

usage:
    fprintf( pErr, "usage: read_genlib [-W float] [-E filename] [-nvh]\n");
    fprintf( pErr, "\t           read the library from a genlib file\n" );  
    fprintf( pErr, "\t           (if the library contains more than one gate\n" );  
    fprintf( pErr, "\t           with the same Boolean function, only the gate\n" );  
    fprintf( pErr, "\t           with the smallest area will be used)\n" );  
    fprintf( pErr, "\t-W float : wire delay (added to pin-to-pin gate delays) [default = %g]\n", WireDelay );  
    fprintf( pErr, "\t-E file :  the file name with gates to be excluded [default = none]\n" );
    fprintf( pErr, "\t-n       : toggle replacing gate/pin names by short strings [default = %s]\n", fShortNames? "yes": "no" );
    fprintf( pErr, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pErr, "\t-h       : enable verbose output\n");
    return 1;       
}